

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O3

void __thiscall
uWS::WebSocketHandshake::static_for<17,_uWS::WebSocketHandshake::Sha1Loop<4>_>::operator()
          (static_for<17,_uWS::WebSocketHandshake::Sha1Loop<4>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  static_for<16,_uWS::WebSocketHandshake::Sha1Loop<4>_> local_11;
  
  static_for<16,_uWS::WebSocketHandshake::Sha1Loop<4>_>::operator()(&local_11,a,b);
  uVar1 = *b ^ b[5] ^ b[10] ^ b[8];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[8] = uVar2;
  uVar1 = a[4];
  a[1] = a[1] + (*a << 5 | *a >> 0x1b) + uVar2 + (a[3] & uVar1 | (a[3] | uVar1) & a[2]) + 0x8f1bbcdc
  ;
  a[4] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }